

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

bool google::protobuf::compiler::java::HasRepeatedFields(Descriptor *descriptor)

{
  byte bVar1;
  FieldDescriptor *pFVar2;
  Nonnull<const_char_*> pcVar3;
  bool v1;
  bool bVar4;
  long lVar5;
  long lVar6;
  
  bVar4 = 0 < descriptor->field_count_;
  if (0 < descriptor->field_count_) {
    lVar6 = 1;
    lVar5 = 0;
    do {
      pFVar2 = descriptor->fields_;
      bVar1 = (&pFVar2->super_SymbolBase)[lVar6].symbol_type_;
      v1 = (bool)((bVar1 & 0x20) >> 5);
      if (0xbf < bVar1 == v1) {
        pcVar3 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                           (v1,0xbf < bVar1,
                            "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar3 != (Nonnull<const_char_*>)0x0) {
        HasRepeatedFields();
      }
      if (((&pFVar2->super_SymbolBase)[lVar6].symbol_type_ & 0x20) != 0) {
        return bVar4;
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x58;
      bVar4 = lVar5 < descriptor->field_count_;
    } while (lVar5 < descriptor->field_count_);
  }
  return bVar4;
}

Assistant:

bool HasRepeatedFields(const Descriptor* descriptor) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    const FieldDescriptor* field = descriptor->field(i);
    if (field->is_repeated()) {
      return true;
    }
  }
  return false;
}